

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void arb1_texld(Context *ctx,char *opcode,int texldd)

{
  uint uVar1;
  int iVar2;
  RegisterList *pRVar3;
  bool bVar4;
  uint local_14c;
  char local_148 [8];
  char src3 [64];
  char src2 [64];
  char src0 [64];
  char *local_80;
  char *ttype;
  RegisterList *sreg;
  int regnum;
  int sm1;
  char dst [64];
  int texldd_local;
  char *opcode_local;
  Context *ctx_local;
  
  if ((((ctx->dest_arg).result_mod & 2U) != 0) && (ctx->profile_supports_nv4 != 0)) {
    (ctx->dest_arg).result_mod = (ctx->dest_arg).result_mod & 0xfffffffd;
  }
  make_ARB1_destarg_string(ctx,(char *)&regnum,0x40);
  iVar2 = shader_version_atleast(ctx,'\x01','\x04');
  bVar4 = iVar2 != 0;
  if (bVar4) {
    local_14c = ctx->source_args[1].regnum;
  }
  else {
    local_14c = (ctx->dest_arg).regnum;
  }
  pRVar3 = reglist_find(&ctx->samplers,REG_TYPE_SAMPLER,local_14c);
  if (bVar4) {
    get_ARB1_srcarg_varname(ctx,0,src2 + 0x38,0x40);
  }
  else {
    get_ARB1_destarg_varname(ctx,src2 + 0x38,0x40);
  }
  memset(src3 + 0x38,0,0x40);
  memset(local_148,0,0x40);
  if (texldd != 0) {
    make_ARB1_srcarg_string(ctx,2,src3 + 0x38,0x40);
    make_ARB1_srcarg_string(ctx,3,local_148,0x40);
  }
  if (pRVar3 == (RegisterList *)0x0) {
    fail(ctx,"TEXLD using undeclared sampler");
  }
  else {
    if ((bVar4) && (iVar2 = no_swizzle(ctx->source_args[1].swizzle), iVar2 == 0)) {
      fail(ctx,"BUG: can\'t handle TEXLD with sampler swizzle at the moment");
    }
    uVar1 = pRVar3->index;
    if (uVar1 == 2) {
      local_80 = "2D";
    }
    else if (uVar1 == 3) {
      local_80 = "CUBE";
    }
    else {
      if (uVar1 != 4) {
        fail(ctx,"unknown texture type");
        return;
      }
      local_80 = "3D";
    }
    if (texldd == 0) {
      output_line(ctx,"%s%s, %s, texture[%d], %s;",opcode,&regnum,src2 + 0x38,(ulong)local_14c,
                  local_80);
    }
    else {
      output_line(ctx,"%s%s, %s, %s, %s, texture[%d], %s;",opcode,&regnum,src2 + 0x38,src3 + 0x38,
                  local_148,local_14c,local_80);
    }
  }
  return;
}

Assistant:

static void arb1_texld(Context *ctx, const char *opcode, const int texldd)
{
    // !!! FIXME: Hack: "TEXH" is invalid in nv4. Fix this more cleanly.
    if ((ctx->dest_arg.result_mod & MOD_PP) && (support_nv4(ctx)))
        ctx->dest_arg.result_mod &= ~MOD_PP;

    char dst[64]; make_ARB1_destarg_string(ctx, dst, sizeof (dst));

    const int sm1 = !shader_version_atleast(ctx, 1, 4);
    const int regnum = sm1 ? ctx->dest_arg.regnum : ctx->source_args[1].regnum;
    RegisterList *sreg = reglist_find(&ctx->samplers, REG_TYPE_SAMPLER, regnum);

    const char *ttype = NULL;
    char src0[64];
    if (sm1)
        get_ARB1_destarg_varname(ctx, src0, sizeof (src0));
    else
        get_ARB1_srcarg_varname(ctx, 0, src0, sizeof (src0));
    //char src1[64]; get_ARB1_srcarg_varname(ctx, 1, src1, sizeof (src1));  // !!! FIXME: SRC_MOD?

    char src2[64] = { 0 };
    char src3[64] = { 0 };

    if (texldd)
    {
        make_ARB1_srcarg_string(ctx, 2, src2, sizeof (src2));
        make_ARB1_srcarg_string(ctx, 3, src3, sizeof (src3));
    } // if

    // !!! FIXME: this should be in state_TEXLD, not in the arb1/glsl emitters.
    if (sreg == NULL)
    {
        fail(ctx, "TEXLD using undeclared sampler");
        return;
    } // if

    // SM1 only specifies dst, so don't check swizzle there.
    if ( !sm1 && (!no_swizzle(ctx->source_args[1].swizzle)) )
    {
        // !!! FIXME: does this ever actually happen?
        fail(ctx, "BUG: can't handle TEXLD with sampler swizzle at the moment");
    } // if

    switch ((const TextureType) sreg->index)
    {
        case TEXTURE_TYPE_2D: ttype = "2D"; break; // !!! FIXME: "RECT"?
        case TEXTURE_TYPE_CUBE: ttype = "CUBE"; break;
        case TEXTURE_TYPE_VOLUME: ttype = "3D"; break;
        default: fail(ctx, "unknown texture type"); return;
    } // switch

    if (texldd)
    {
        output_line(ctx, "%s%s, %s, %s, %s, texture[%d], %s;", opcode, dst,
                    src0, src2, src3, regnum, ttype);
    } // if
    else
    {
        output_line(ctx, "%s%s, %s, texture[%d], %s;", opcode, dst, src0,
                    regnum, ttype);
    } // else
}